

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O3

int wally_asset_pak_whitelistproof
              (uchar *online_keys,size_t online_keys_len,uchar *offline_keys,size_t offline_keys_len
              ,size_t key_index,uchar *sub_pubkey,size_t sub_pubkey_len,uchar *online_priv_key,
              size_t online_priv_key_len,uchar *summed_key,size_t summed_key_len,uchar *bytes_out,
              size_t len,size_t *written)

{
  secp256k1_context_struct *ctx;
  int iVar1;
  secp256k1_pubkey *pubkey_00;
  int iVar2;
  ulong uVar3;
  ulong n_keys;
  secp256k1_pubkey *pubkey_01;
  size_t sig_size;
  secp256k1_pubkey pubkey;
  secp256k1_whitelist_signature sig;
  secp256k1_pubkey offline_secp_keys [256];
  secp256k1_pubkey online_secp_keys [256];
  uchar *local_a0c0;
  ulong local_a0b0;
  secp256k1_context_struct *local_a0a8;
  secp256k1_pubkey local_a0a0;
  secp256k1_whitelist_signature local_a060;
  secp256k1_pubkey local_8038 [256];
  secp256k1_pubkey local_4038 [256];
  
  local_a0a8 = secp_ctx();
  n_keys = offline_keys_len / 0x21;
  uVar3 = n_keys * 0x20 + 0x21;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (local_a0a8 == (secp256k1_context_struct *)0x0) {
    iVar2 = -3;
  }
  else {
    iVar2 = -2;
    if (((((online_keys != (uchar *)0x0) && (offline_keys_len == n_keys * 0x21)) &&
         (offline_keys_len != 0)) &&
        ((offline_keys != (uchar *)0x0 && (online_keys_len == offline_keys_len)))) &&
       ((summed_key_len == 0x20 && summed_key != (uchar *)0x0) &&
        ((online_priv_key_len == 0x20 && online_priv_key != (uchar *)0x0) &&
        (sub_pubkey_len == 0x21 &&
        ((sub_pubkey != (uchar *)0x0 && offline_keys_len < 0x2121) && key_index < n_keys))))) {
      local_a0b0 = uVar3;
      iVar1 = pubkey_parse(&local_a0a0,sub_pubkey,0x21);
      if (((written != (size_t *)0x0) && (len != 0)) &&
         ((bytes_out != (uchar *)0x0 && (iVar1 != 0)))) {
        if (len < uVar3) {
          *written = uVar3;
          iVar2 = 0;
        }
        else {
          if (0x20 < offline_keys_len) {
            pubkey_00 = local_8038;
            pubkey_01 = local_4038;
            iVar2 = -2;
            uVar3 = n_keys;
            local_a0c0 = offline_keys;
            do {
              iVar1 = pubkey_parse(pubkey_01,online_keys,0x21);
              if (iVar1 == 0) goto LAB_0016c42d;
              iVar1 = pubkey_parse(pubkey_00,local_a0c0,0x21);
              if (iVar1 == 0) goto LAB_0016c42d;
              pubkey_00 = pubkey_00 + 1;
              local_a0c0 = local_a0c0 + 0x21;
              online_keys = online_keys + 0x21;
              pubkey_01 = pubkey_01 + 1;
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
          ctx = local_a0a8;
          iVar1 = secp256k1_whitelist_sign
                            (local_a0a8,&local_a060,local_4038,local_8038,n_keys,&local_a0a0,
                             online_priv_key,summed_key,key_index,(secp256k1_nonce_function)0x0,
                             (void *)0x0);
          iVar2 = -1;
          if (iVar1 != 0) {
            iVar1 = secp256k1_whitelist_verify
                              (ctx,&local_a060,local_4038,local_8038,n_keys,&local_a0a0);
            if (iVar1 != 0) {
              iVar1 = secp256k1_whitelist_signature_serialize(ctx,bytes_out,&local_a0b0,&local_a060)
              ;
              if (iVar1 != 0) {
                *written = local_a0b0;
                iVar2 = 0;
              }
            }
          }
LAB_0016c42d:
          wally_clear_3(local_4038,0x4000,local_8038,0x4000,&local_a0a0,0x40);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_asset_pak_whitelistproof(
    const unsigned char *online_keys,
    size_t online_keys_len,
    const unsigned char *offline_keys,
    size_t offline_keys_len,
    size_t key_index,
    const unsigned char *sub_pubkey,
    size_t sub_pubkey_len,
    const unsigned char *online_priv_key,
    size_t online_priv_key_len,
    const unsigned char *summed_key,
    size_t summed_key_len,
    unsigned char *bytes_out,
    size_t len,
    size_t *written)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_pubkey online_secp_keys[SECP256K1_WHITELIST_MAX_N_KEYS];
    secp256k1_pubkey offline_secp_keys[SECP256K1_WHITELIST_MAX_N_KEYS];
    secp256k1_pubkey pubkey;
    secp256k1_whitelist_signature sig;
    const size_t num_keys = offline_keys_len / EC_PUBLIC_KEY_LEN;
    size_t sig_size = (1 + 32 * (1 + num_keys));
    size_t i;
    int ret;

    if (written)
        *written = 0;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!online_keys || online_keys_len != offline_keys_len ||
        !offline_keys || !offline_keys_len ||
        offline_keys_len % EC_PUBLIC_KEY_LEN || key_index >= num_keys ||
        num_keys > SECP256K1_WHITELIST_MAX_N_KEYS ||
        !sub_pubkey || sub_pubkey_len != EC_PUBLIC_KEY_LEN ||
        !online_priv_key || online_priv_key_len != EC_PRIVATE_KEY_LEN ||
        !summed_key || summed_key_len != EC_PRIVATE_KEY_LEN ||
        !pubkey_parse(&pubkey, sub_pubkey, sub_pubkey_len) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (len < sig_size) {
        *written = sig_size;
        return WALLY_OK; /* Tell the caller the required size */
    }

    for (i = 0; i < num_keys; ++i) {
        if (!pubkey_parse(&online_secp_keys[i], online_keys + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN) ||
            !pubkey_parse(&offline_secp_keys[i], offline_keys + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN)) {
            ret = WALLY_EINVAL;
            goto fail;
        }
    }

    if (secp256k1_whitelist_sign(ctx, &sig, online_secp_keys, offline_secp_keys, num_keys,
                                 &pubkey, online_priv_key, summed_key, key_index, NULL, NULL) &&
        secp256k1_whitelist_verify(ctx, &sig, online_secp_keys, offline_secp_keys, num_keys, &pubkey) &&
        secp256k1_whitelist_signature_serialize(ctx, bytes_out, &sig_size, &sig)) {
        ret = WALLY_OK;
        *written = sig_size;
    } else
        ret = WALLY_ERROR;

fail:
    wally_clear_3(online_secp_keys, sizeof(online_secp_keys),
                  offline_secp_keys, (sizeof(offline_secp_keys)),
                  &pubkey, sizeof(pubkey));
    return ret;
}